

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

string * __thiscall
cmCTestGIT::FindGitDir_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  undefined1 local_190 [8];
  OutputLogger rev_parse_err;
  OneLineParser rev_parse_out;
  string git_dir_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  string local_98 [32];
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_rev_parse;
  string local_40 [8];
  string git;
  cmCTestGIT *this_local;
  string *git_dir;
  
  git.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string
            (local_40,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool);
  git_dir_line.field_2._M_local_buf[0xd] = '\x01';
  std::__cxx11::string::string((string *)&local_d8,local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"rev-parse",(allocator<char> *)(git_dir_line.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"--git-dir",(allocator<char> *)(git_dir_line.field_2._M_local_buf + 0xe));
  git_dir_line.field_2._M_local_buf[0xd] = '\0';
  local_78 = &local_d8;
  local_70 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(git_dir_line.field_2._M_local_buf + 0xc));
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_68,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(git_dir_line.field_2._M_local_buf + 0xc));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(git_dir_line.field_2._M_local_buf + 0xc));
  local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78;
  do {
    local_238 = local_238 + -1;
    std::__cxx11::string::~string((string *)local_238);
  } while (local_238 != &local_d8);
  std::allocator<char>::~allocator((allocator<char> *)(git_dir_line.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(git_dir_line.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&rev_parse_out.Line1);
  OneLineParser::OneLineParser
            ((OneLineParser *)&rev_parse_err.super_LineParser.Separator,this,"rev-parse-out> ",
             (string *)&rev_parse_out.Line1);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_190,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "rev-parse-err> ");
  std::__cxx11::string::string((string *)&local_1b0);
  bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_68,(OutputParser *)&rev_parse_err.super_LineParser.Separator,
                              (OutputParser *)local_190,&local_1b0,UTF8);
  std::__cxx11::string::~string((string *)&local_1b0);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&rev_parse_out.Line1)
    ;
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,".git");
  }
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  if (*pcVar3 == '.') {
    std::operator+(&local_1f0,&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,"/");
    std::operator+(&local_1d0,&local_1f0,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  git.field_2._M_local_buf[0xf] = '\x01';
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_190);
  OneLineParser::~OneLineParser((OneLineParser *)&rev_parse_err.super_LineParser.Separator);
  std::__cxx11::string::~string((string *)&rev_parse_out.Line1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  std::__cxx11::string::~string(local_40);
  if ((git.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::FindGitDir()
{
  std::string git_dir;

  // Run "git rev-parse --git-dir" to locate the real .git directory.
  std::string git = this->CommandLineTool;
  std::vector<std::string> git_rev_parse = { git, "rev-parse", "--git-dir" };
  std::string git_dir_line;
  OneLineParser rev_parse_out(this, "rev-parse-out> ", git_dir_line);
  OutputLogger rev_parse_err(this->Log, "rev-parse-err> ");
  if (this->RunChild(git_rev_parse, &rev_parse_out, &rev_parse_err,
                     std::string{}, cmProcessOutput::UTF8)) {
    git_dir = git_dir_line;
  }
  if (git_dir.empty()) {
    git_dir = ".git";
  }

  // Git reports a relative path only when the .git directory is in
  // the current directory.
  if (git_dir[0] == '.') {
    git_dir = this->SourceDirectory + "/" + git_dir;
  }
#if defined(_WIN32) && !defined(__CYGWIN__)
  else if (git_dir[0] == '/') {
    // Cygwin Git reports a full path that Cygwin understands, but we
    // are a Windows application.  Run "cygpath" to get Windows path.
    std::string cygpath_exe =
      cmStrCat(cmSystemTools::GetFilenamePath(git), "/cygpath.exe");
    if (cmSystemTools::FileExists(cygpath_exe)) {
      std::vector<std::string> cygpath = { cygpath_exe, "-w", git_dir };
      OneLineParser cygpath_out(this, "cygpath-out> ", git_dir_line);
      OutputLogger cygpath_err(this->Log, "cygpath-err> ");
      if (this->RunChild(cygpath, &cygpath_out, &cygpath_err, std::string{},
                         cmProcessOutput::UTF8)) {
        git_dir = git_dir_line;
      }
    }
  }
#endif
  return git_dir;
}